

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_if.cpp
# Opt level: O0

IfCase __thiscall pfederc::Parser::parseIfStart(Parser *this,bool isensure)

{
  bool bVar1;
  Token *pTVar2;
  byte in_DL;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
  extraout_RDX;
  undefined7 in_register_00000031;
  Parser *this_00;
  IfCase IVar3;
  undefined1 local_78 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  undefined1 local_58 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> cond;
  undefined1 local_38 [31];
  byte local_19;
  Parser *pPStack_18;
  bool isensure_local;
  Parser *this_local;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,isensure);
  local_19 = in_DL & 1;
  pPStack_18 = this_00;
  this_local = this;
  if ((local_19 == 0) || (bVar1 = expect(this_00,TOK_KW_ENSURE), bVar1)) {
    if (((local_19 & 1) == 0) && (bVar1 = expect(this_00,TOK_KW_IF), !bVar1)) {
      cond._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._6_2_ = 2;
      cond._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._0_4_ = 0x22;
      pTVar2 = Lexer::getCurrentToken(this_00->lexer);
      Token::getPosition(pTVar2);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&stack0xffffffffffffffb8,
                 (SyntaxErrorCode *)
                 ((long)&cond._M_t.
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6),
                 (Position *)&cond);
      generateError((Parser *)&stack0xffffffffffffffc0,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this_00);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffc0);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&stack0xffffffffffffffb8);
    }
  }
  else {
    local_38._6_2_ = 2;
    local_38._0_4_ = 0x23;
    pTVar2 = Lexer::getCurrentToken(this_00->lexer);
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_38 + 8),(SyntaxErrorCode *)(local_38 + 6),(Position *)local_38);
    generateError((Parser *)(local_38 + 0x10),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_00);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_38 + 0x10));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_38 + 8));
  }
  parseExpression((Parser *)local_58,isensure);
  bVar1 = expect(this_00,TOK_EOL);
  if (!bVar1) {
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._6_2_ = 2;
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0xf;
    pTVar2 = Lexer::getCurrentToken(this_00->lexer);
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&stack0xffffffffffffff98,
               (SyntaxErrorCode *)
               ((long)&bodyExpr._M_t.
                       super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                       .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 6),
               (Position *)&bodyExpr);
    generateError((Parser *)&stack0xffffffffffffffa0,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_00);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa0);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&stack0xffffffffffffff98);
    skipToEol(this_00);
  }
  parseFunctionBody((Parser *)local_78);
  std::
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  ::
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_true>
            ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
              *)this,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58,
             (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_78);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_78);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
  IVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
  ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  IVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
        )(_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
          )this;
  return (IfCase)IVar3.
                 super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  ;
}

Assistant:

IfCase Parser::parseIfStart(bool isensure) noexcept {
  // parse 'ensure' or 'if'
  if (isensure && !expect(TokenType::TOK_KW_ENSURE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_ENSURE,
          lexer.getCurrentToken()->getPosition()));
  } else if (!isensure && !expect(TokenType::TOK_KW_IF)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_IF,
          lexer.getCurrentToken()->getPosition()));
  }
  // parse condition
  std::unique_ptr<Expr> cond(parseExpression());
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  // result
  return IfCase(std::move(cond), std::move(bodyExpr));
}